

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O0

void do_abs(void *x,int n,int type)

{
  uint uVar1;
  ulong uVar2;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double *y_4;
  int i_4;
  float *y_3;
  int i_3;
  longlong *y_2;
  int i_2;
  long *y_1;
  int i_1;
  int *y;
  int i;
  undefined8 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined8 local_78;
  undefined8 local_70;
  undefined4 local_64;
  undefined4 local_54;
  undefined4 local_44;
  undefined4 local_34;
  undefined4 local_24;
  undefined4 local_14;
  
  if (in_EDX == -99) {
    for (local_14 = 0; local_14 < in_ESI; local_14 = local_14 + 1) {
      if (*(int *)(in_RDI + (long)local_14 * 4) < 0) {
        local_64 = -*(int *)(in_RDI + (long)local_14 * 4);
      }
      else {
        local_64 = *(int *)(in_RDI + (long)local_14 * 4);
      }
      *(int *)(in_RDI + (long)local_14 * 4) = local_64;
    }
  }
  else if (in_EDX == -0x65) {
    for (local_24 = 0; local_24 < in_ESI; local_24 = local_24 + 1) {
      if (*(long *)(in_RDI + (long)local_24 * 8) < 0) {
        local_70 = -*(long *)(in_RDI + (long)local_24 * 8);
      }
      else {
        local_70 = *(long *)(in_RDI + (long)local_24 * 8);
      }
      *(long *)(in_RDI + (long)local_24 * 8) = local_70;
    }
  }
  else if (in_EDX == -0x66) {
    for (local_34 = 0; local_34 < in_ESI; local_34 = local_34 + 1) {
      if (*(long *)(in_RDI + (long)local_34 * 8) < 0) {
        local_78 = -*(long *)(in_RDI + (long)local_34 * 8);
      }
      else {
        local_78 = *(long *)(in_RDI + (long)local_34 * 8);
      }
      *(long *)(in_RDI + (long)local_34 * 8) = local_78;
    }
  }
  else if (in_EDX == -0x132) {
    for (local_44 = 0; local_44 < in_ESI; local_44 = local_44 + 1) {
      if (*(float *)(in_RDI + (long)local_44 * 4) < 0.0) {
        uVar1 = *(uint *)(in_RDI + (long)local_44 * 4) ^ 0x80000000;
      }
      else {
        uVar1 = *(uint *)(in_RDI + (long)local_44 * 4);
      }
      *(uint *)(in_RDI + (long)local_44 * 4) = uVar1;
    }
  }
  else if (in_EDX == -0x133) {
    for (local_54 = 0; local_54 < in_ESI; local_54 = local_54 + 1) {
      if (*(double *)(in_RDI + (long)local_54 * 8) < 0.0) {
        uVar2 = *(ulong *)(in_RDI + (long)local_54 * 8) ^ 0x8000000000000000;
      }
      else {
        uVar2 = *(ulong *)(in_RDI + (long)local_54 * 8);
      }
      *(ulong *)(in_RDI + (long)local_54 * 8) = uVar2;
    }
  }
  else {
    comex_error((char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  }
  return;
}

Assistant:

static void do_abs(void *ptr, int nelem, int type)
{
    int i;
    double x2;
    float sx2;
    switch (type){
         int *ia;
         double *da;
         float *fa;
         DoubleComplex *ca,val;
         SingleComplex *cfa,cval;
         long *la;

         case C_INT:
              ia = (int *)ptr; 
              for(i=0;i<nelem;i++)
                  ia[i]= GA_ABS(ia[i]);
              break; 
         case C_DCPL:
              ca = (DoubleComplex *) ptr;
              for(i=0;i<nelem;i++){
#if HAVE_HYPOT
                  ca[i].real = hypot(ca[i].real, ca[i].imag);
#else
                  val = ca[i];
                  /* DJB: This algorithm can lead to overflows when
                     and underflows when not necessary.
                  ca[i].real = sqrt(val.real * val.real + val.imag *val.imag);
                  ca[i].imag = 0.0;
                     Better (but slower) is: */
                  if (GA_ABS(val.real) >= GA_ABS(val.imag)) {
                      if (val.real == (double)0.0) {
                          ca[i].real = (double)0.0;
                      } else {
                          x2 = val.imag/val.real;
                          ca[i].real = GA_ABS(val.real)*sqrt(1.0+(x2*x2));
                      }
                  } else {
                      x2 = val.real/val.imag;
                      ca[i].real = GA_ABS(val.imag)*sqrt(1.0+(x2*x2));
                  }
#endif
                  ca[i].imag=(double)0.0;
              }
              break;
         case C_SCPL:
              cfa = (SingleComplex *) ptr;
              for(i=0;i<nelem;i++){
#if HAVE_HYPOT
                  cfa[i].real = hypotf(cfa[i].real, cfa[i].imag);
#else
                  cval = cfa[i];
                  /* DJB: This algorithm can lead to overflows when
                     and underflows when not necessary.
                  cfa[i].real = sqrt(cval.real * cval.real + cval.imag *cval.imag);
                  cfa[i].imag = 0.0;
                     Better (but slower) is: */
                  if (GA_ABS(cval.real) >= GA_ABS(cval.imag)) {
                      if (cval.real == 0.0f) {
                          cfa[i].real = 0.0f;
                      } else {
                          sx2 = cval.imag/cval.real;
                          cfa[i].real = GA_ABS(cval.real)*sqrt(1.0f+(sx2*sx2));
                      }
                  } else {
                      sx2 = cval.real/cval.imag;
                      cfa[i].real = GA_ABS(cval.imag)*sqrt(1.0f+(sx2*sx2));
                  }
#endif
                  cfa[i].imag=0.0f;
              }
              break;
  	 case C_DBL:
              da = (double *) ptr;
              for(i=0;i<nelem;i++)
                  da[i]= GA_ABS(da[i]);
              break;
         case C_FLOAT:
              fa = (float *)ptr;
              for(i=0;i<nelem;i++)
                  fa[i]= GA_ABS(fa[i]);
              break;
 	case C_LONG:
              la = (long *)ptr;
              for(i=0;i<nelem;i++)
                  la[i]= GA_ABS(la[i]);
              break;

         default: pnga_error("wrong data type",type);
    }
}